

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O3

bool __thiscall ProtocolARP::IsLocal(ProtocolARP *this,uint8_t *protocolAddress)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  uint8_t *puVar5;
  size_t sVar6;
  uint uVar7;
  
  sVar4 = ProtocolIPv4::AddressSize(this->IP);
  if (sVar4 == 0) {
    sVar4 = 0;
  }
  else {
    uVar7 = 1;
    sVar4 = 0;
    do {
      bVar1 = protocolAddress[sVar4];
      puVar5 = ProtocolIPv4::GetSubnetMask(this->IP);
      bVar2 = puVar5[sVar4];
      puVar5 = ProtocolIPv4::GetUnicastAddress(this->IP);
      bVar3 = puVar5[sVar4];
      puVar5 = ProtocolIPv4::GetSubnetMask(this->IP);
      if ((bVar1 & bVar2) != (bVar3 & puVar5[sVar4])) break;
      sVar4 = (size_t)uVar7;
      sVar6 = ProtocolIPv4::AddressSize(this->IP);
      uVar7 = uVar7 + 1;
    } while (sVar4 < sVar6);
  }
  sVar6 = ProtocolIPv4::AddressSize(this->IP);
  return sVar6 == sVar4;
}

Assistant:

bool ProtocolARP::IsLocal(const uint8_t* protocolAddress)
{
    uint32_t i;

    for (i = 0; i < IP.AddressSize(); i++)
    {
        if ((protocolAddress[i] & IP.GetSubnetMask()[i]) !=
            (IP.GetUnicastAddress()[i] & IP.GetSubnetMask()[i]))
        {
            break;
        }
    }

    return i == IP.AddressSize();
}